

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O0

void __thiscall
Imf_2_5::ChannelList::channelsWithPrefix
          (ChannelList *this,char *prefix,ConstIterator *first,ConstIterator *last)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *__s1;
  ConstIterator *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  size_t n;
  map<Imf_2_5::Name,_Imf_2_5::Channel,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  *in_stack_fffffffffffffe98;
  Name *in_stack_fffffffffffffea0;
  ConstIterator *x;
  const_iterator local_148;
  ConstIterator local_140;
  size_t local_138;
  const_iterator local_30;
  const_iterator local_28;
  ConstIterator *local_20;
  undefined8 *local_18;
  char *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Name::Name(in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
  local_30 = std::
             map<Imf_2_5::Name,_Imf_2_5::Channel,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
             ::lower_bound(in_stack_fffffffffffffe98,(key_type *)0x11b505);
  ConstIterator::ConstIterator((ConstIterator *)&local_28,&local_30);
  (local_20->_i)._M_node = local_28._M_node;
  *local_18 = (local_20->_i)._M_node;
  local_138 = strlen(local_10);
  while( true ) {
    x = local_20;
    local_148 = std::
                map<Imf_2_5::Name,_Imf_2_5::Channel,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
                ::end(in_stack_fffffffffffffe98);
    ConstIterator::ConstIterator(&local_140,&local_148);
    bVar2 = Imf_2_5::operator!=(x,(ConstIterator *)in_stack_fffffffffffffe98);
    bVar1 = false;
    if (bVar2) {
      __s1 = ConstIterator::name((ConstIterator *)0x11b5ab);
      iVar3 = strncmp(__s1,local_10,local_138);
      bVar1 = iVar3 < 1;
    }
    if (!bVar1) break;
    ConstIterator::operator++(x);
  }
  return;
}

Assistant:

void
ChannelList::channelsWithPrefix (const char prefix[],
				 ConstIterator &first,
				 ConstIterator &last) const
{
    first = last = _map.lower_bound (prefix);
    size_t n = strlen (prefix);

    while (last != ConstIterator (_map.end()) &&
	   strncmp (last.name(), prefix, n) <= 0)
    {
	++last;
    }
}